

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O0

void __thiscall
hungarian_algorithm::
BruteForceSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>,_std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>,_unsigned_long>
::BruteForceSolver(BruteForceSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>,_std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>,_unsigned_long>
                   *this,matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
                         *cost_function,unsigned_long num_rows,unsigned_long num_cols,
                  less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_> *cost_comparator,
                  duration<long,_boost::ratio<1L,_1L>_> *zero_cost)

{
  size_type sVar1;
  allocator<bool> local_4f;
  bool local_4e;
  allocator<unsigned_long> local_4d [20];
  allocator<unsigned_long> local_39;
  duration<long,_boost::ratio<1L,_1L>_> *local_38;
  duration<long,_boost::ratio<1L,_1L>_> *zero_cost_local;
  less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_> *cost_comparator_local;
  unsigned_long num_cols_local;
  unsigned_long num_rows_local;
  matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
  *cost_function_local;
  BruteForceSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>,_std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>,_unsigned_long>
  *this_local;
  
  this->cost_function_ = cost_function;
  this->cost_comparator_ = cost_comparator;
  (this->zero_cost_).rep_ = zero_cost->rep_;
  this->num_rows_ = num_rows;
  this->num_cols_ = num_cols;
  sVar1 = this->num_rows_;
  local_38 = zero_cost;
  zero_cost_local = (duration<long,_boost::ratio<1L,_1L>_> *)cost_comparator;
  cost_comparator_local = (less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_> *)num_cols;
  num_cols_local = num_rows;
  num_rows_local = (unsigned_long)cost_function;
  cost_function_local =
       (matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
        *)this;
  std::allocator<unsigned_long>::allocator(&local_39);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->current_assignment_,sVar1,&this->num_cols_,&local_39);
  std::allocator<unsigned_long>::~allocator(&local_39);
  sVar1 = this->num_rows_;
  std::allocator<unsigned_long>::allocator(local_4d);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->optimal_assignment_,sVar1,&this->num_cols_,local_4d);
  std::allocator<unsigned_long>::~allocator(local_4d);
  sVar1 = this->num_cols_;
  local_4e = false;
  std::allocator<bool>::allocator(&local_4f);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->covered_cols_,sVar1,&local_4e,&local_4f);
  std::allocator<bool>::~allocator(&local_4f);
  std::pair<unsigned_long,_boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>::pair
            (&this->optimal_cost_,&this->num_rows_,local_38);
  return;
}

Assistant:

BruteForceSolver(const CostFunction& cost_function, const Size num_rows, const Size num_cols,
                   const CostComparator& cost_comparator, const Cost& zero_cost)
    : cost_function_(cost_function), cost_comparator_(cost_comparator), zero_cost_(zero_cost),
      num_rows_(static_cast<std::size_t>(num_rows)), num_cols_(static_cast<std::size_t>(num_cols)),
      current_assignment_(num_rows_, num_cols_), optimal_assignment_(num_rows_, num_cols_),
      covered_cols_(num_cols_, false), optimal_cost_(num_rows_, zero_cost)
  {
  }